

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

void __thiscall PPointer::SetOps(PPointer *this)

{
  PType *pPVar1;
  PClass *pPVar2;
  byte bVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  bool bVar6;
  
  (this->super_PBasicType).super_PType.storeOp = '1';
  pPVar2 = PClass::RegistrationInfo.MyClass;
  pPVar1 = this->PointedType;
  if (pPVar1 == (PType *)0x0) {
    bVar3 = 0x1e;
  }
  else {
    if ((pPVar1->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar4 = (**(pPVar1->super_PTypeBase).super_DObject._vptr_DObject)(pPVar1);
      (pPVar1->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar4);
    }
    pPVar5 = (pPVar1->super_PTypeBase).super_DObject.Class;
    bVar6 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar2 && bVar6) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar6 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar2) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    bVar3 = (bVar6 ^ 1U) * '\x02' | 0x1c;
  }
  (this->super_PBasicType).super_PType.loadOp = bVar3;
  (this->super_PBasicType).super_PType.moveOp = ';';
  (this->super_PBasicType).super_PType.RegType = '\x03';
  return;
}

Assistant:

void PPointer::SetOps()
{
	storeOp = OP_SP;
	loadOp = (PointedType && PointedType->IsKindOf(RUNTIME_CLASS(PClass))) ? OP_LO : OP_LP;
	moveOp = OP_MOVEA;
	RegType = REGT_POINTER;
}